

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Device>
          (TestStatus *__return_storage_ptr__,Context *context,Context *param_3)

{
  RefData<vk::VkDevice_s_*> data;
  ulong __n;
  TestContext *pTVar1;
  TestLog *this;
  MessageBuilder *pMVar2;
  Unique<vk::VkDevice_s_*> *this_00;
  reference this_01;
  allocator<char> local_441;
  string local_440;
  undefined1 local_419;
  Move<vk::VkDevice_s_*> local_418;
  RefData<vk::VkDevice_s_*> local_400;
  SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_> local_3e8;
  uint local_3d4;
  char *pcStack_3d0;
  deUint32 ndx;
  MessageBuilder local_3c8;
  undefined4 local_248;
  deUint32 watchdogInterval;
  allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_> local_231;
  undefined1 local_230 [8];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  objects;
  Resources res;
  Environment env;
  deUint32 numObjects;
  Context *context_local;
  TestStatus *local_10;
  
  context_local = param_3;
  local_10 = __return_storage_ptr__;
  env._52_4_ = Device::getMaxConcurrent(context,(Parameters *)&context_local);
  Environment::Environment((Environment *)&res.queueFamilyIndex,context,env._52_4_);
  Device::Resources::Resources
            ((Resources *)
             &objects.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Environment *)&res.queueFamilyIndex,(Parameters *)&context_local);
  __n = (ulong)(uint)env._52_4_;
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>::allocator(&local_231);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
            *)local_230,__n,&local_231);
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>::~allocator(&local_231);
  local_248 = 0x400;
  pTVar1 = Context::getTestContext(context);
  this = tcu::TestContext::getLog(pTVar1);
  tcu::TestLog::operator<<(&local_3c8,this,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_3c8,(char (*) [10])"Creating ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)&env.field_0x34);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x13776be);
  pcStack_3d0 = ::vk::getTypeName<vk::VkDevice_s*>();
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&stack0xfffffffffffffc30);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [9])0x13477db);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3c8);
  for (local_3d4 = 0; local_3d4 < (uint)env._52_4_; local_3d4 = local_3d4 + 1) {
    this_00 = (Unique<vk::VkDevice_s_*> *)operator_new(0x18);
    local_419 = 1;
    Device::create(&local_418,(Environment *)&res.queueFamilyIndex,
                   (Resources *)
                   &objects.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(Parameters *)&context_local)
    ;
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_400,(Move *)&local_418);
    data.deleter.m_destroyDevice = local_400.deleter.m_destroyDevice;
    data.object = local_400.object;
    data.deleter.m_allocator = local_400.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique(this_00,data);
    local_419 = 0;
    de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>::SharedPtr(&local_3e8,this_00);
    this_01 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
                            *)local_230,(ulong)local_3d4);
    de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>::operator=(this_01,&local_3e8);
    de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>::~SharedPtr(&local_3e8);
    ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move(&local_418);
    if ((local_3d4 != 0) && ((local_3d4 & 0x3ff) == 0)) {
      pTVar1 = Context::getTestContext(context);
      tcu::TestContext::touchWatchdog(pTVar1);
    }
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  ::clear((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
           *)local_230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"Ok",&local_441);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
             *)local_230);
  Device::Resources::~Resources
            ((Resources *)
             &objects.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}